

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void std::__insertion_sort<QList<QByteArrayView>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (iterator __first,QByteArrayView *__last)

{
  qsizetype qVar1;
  storage_type *psVar2;
  bool bVar3;
  iterator __last_00;
  
  if (__first.i != __last) {
    for (__last_00.i = __first.i + 1; __last_00.i != __last; __last_00.i = __last_00.i + 1) {
      bVar3 = ::operator<(__last_00.i,__first.i);
      if (bVar3) {
        qVar1 = (__last_00.i)->m_size;
        psVar2 = (__last_00.i)->m_data;
        __copy_move_backward<true,false,std::random_access_iterator_tag>::
        __copy_move_b<QList<QByteArrayView>::iterator,QList<QByteArrayView>::iterator>
                  (__first,__last_00,__last_00.i + 1);
        (__first.i)->m_size = qVar1;
        (__first.i)->m_data = psVar2;
      }
      else {
        __unguarded_linear_insert<QList<QByteArrayView>::iterator,__gnu_cxx::__ops::_Val_less_iter>
                  (__last_00.i);
      }
    }
  }
  return;
}

Assistant:

inline constexpr bool operator!=(iterator o) const { return i != o.i; }